

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 make_CD_heap(hashelement_t **triphonehash,int32 threshold,heapelement_t ***CDheap,
                  int32 *cdheapsize)

{
  heapelement_t *newelement;
  char *pcVar1;
  int32 local_48;
  int local_44;
  int32 heapsize;
  int32 i;
  hashelement_t *triphone_el;
  heapelement_t *addtriphone;
  heapelement_t **heap;
  int32 *cdheapsize_local;
  heapelement_t ***CDheap_local;
  hashelement_t **pphStack_10;
  int32 threshold_local;
  hashelement_t **triphonehash_local;
  
  addtriphone = (heapelement_t *)0x0;
  local_48 = 0;
  local_44 = 0;
  heap = (heapelement_t **)cdheapsize;
  cdheapsize_local = (int32 *)CDheap;
  CDheap_local._4_4_ = threshold;
  pphStack_10 = triphonehash;
  do {
    if (24000 < local_44) {
      *(heapelement_t **)cdheapsize_local = addtriphone;
      *(int32 *)heap = local_48;
      return 0;
    }
    for (_heapsize = pphStack_10[local_44]; _heapsize != (hashelement_t *)0x0;
        _heapsize = _heapsize->next) {
      if (CDheap_local._4_4_ <= _heapsize->count) {
        newelement = (heapelement_t *)calloc(1,0x28);
        if (newelement == (heapelement_t *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x29d,"Heap install error. Out of memory!\n");
          exit(1);
        }
        pcVar1 = strdup(_heapsize->basephone);
        newelement->basephone = pcVar1;
        pcVar1 = strdup(_heapsize->leftcontext);
        newelement->leftcontext = pcVar1;
        pcVar1 = strdup(_heapsize->rightcontext);
        newelement->rightcontext = pcVar1;
        pcVar1 = strdup(_heapsize->wordposition);
        newelement->wordposition = pcVar1;
        local_48 = insert((heapelement_t ***)&addtriphone,local_48,newelement);
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int32 make_CD_heap(hashelement_t  **triphonehash,
		   int32  threshold,
		   heapelement_t ***CDheap,
		   int32  *cdheapsize)
{
    heapelement_t **heap=NULL, *addtriphone;
    hashelement_t *triphone_el;
    int32 i, heapsize;

    heapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = triphonehash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count >= threshold) {
		addtriphone = (heapelement_t *) calloc(1,sizeof(heapelement_t));
		if (addtriphone == NULL)
		    E_FATAL("Heap install error. Out of memory!\n");
		addtriphone->basephone = strdup(triphone_el->basephone);
		addtriphone->leftcontext = strdup(triphone_el->leftcontext);
		addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	        addtriphone->wordposition = strdup(triphone_el->wordposition);
		heapsize = insert(&heap, heapsize, addtriphone);
            }
	    triphone_el = triphone_el->next;
        }
    }
    *CDheap = heap;
    *cdheapsize = heapsize;

    return S3_SUCCESS;
}